

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O0

BigInteger * __thiscall rapidjson::internal::BigInteger::operator<<=(BigInteger *this,size_t shift)

{
  bool bVar1;
  RapidJSONException *this_00;
  sbyte sVar2;
  ulong uVar3;
  size_t local_48;
  size_t i;
  size_t interShift;
  size_t offset;
  size_t shift_local;
  BigInteger *this_local;
  
  bVar1 = IsZero(this);
  if ((!bVar1) && (shift != 0)) {
    uVar3 = shift >> 6;
    if (0x1a0 < this->count_ + uVar3) {
      this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
      cereal::RapidJSONException::RapidJSONException
                (this_00,"rapidjson internal assertion failure: count_ + offset <= kCapacity");
      __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,
                  cereal::RapidJSONException::~RapidJSONException);
    }
    if ((shift & 0x3f) == 0) {
      memmove(this->digits_ + uVar3,this,this->count_ << 3);
      this->count_ = uVar3 + this->count_;
    }
    else {
      this->digits_[this->count_] = 0;
      for (local_48 = this->count_; sVar2 = (sbyte)(shift & 0x3f), local_48 != 0;
          local_48 = local_48 - 1) {
        this->digits_[local_48 + uVar3] =
             this->digits_[local_48] << sVar2 |
             this->digits_[local_48 - 1] >> (0x40U - sVar2 & 0x3f);
      }
      this->digits_[uVar3] = this->digits_[0] << sVar2;
      this->count_ = uVar3 + this->count_;
      if (this->digits_[this->count_] != 0) {
        this->count_ = this->count_ + 1;
      }
    }
    memset(this,0,uVar3 << 3);
  }
  return this;
}

Assistant:

BigInteger& operator<<=(size_t shift) {
        if (IsZero() || shift == 0) return *this;

        size_t offset = shift / kTypeBit;
        size_t interShift = shift % kTypeBit;
        CEREAL_RAPIDJSON_ASSERT(count_ + offset <= kCapacity);

        if (interShift == 0) {
            std::memmove(digits_ + offset, digits_, count_ * sizeof(Type));
            count_ += offset;
        }
        else {
            digits_[count_] = 0;
            for (size_t i = count_; i > 0; i--)
                digits_[i + offset] = (digits_[i] << interShift) | (digits_[i - 1] >> (kTypeBit - interShift));
            digits_[offset] = digits_[0] << interShift;
            count_ += offset;
            if (digits_[count_])
                count_++;
        }

        std::memset(digits_, 0, offset * sizeof(Type));

        return *this;
    }